

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void slang::ast::InstanceSymbol::fromFixupSyntax
               (Compilation *comp,DefinitionSymbol *definition,DataDeclarationSyntax *syntax,
               ASTContext *context,SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> this;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  int iVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  SourceLocation SVar4;
  Diagnostic *this_00;
  HierarchicalInstanceSyntax *pHVar5;
  undefined4 extraout_var;
  HierarchyInstantiationSyntax *syntax_00;
  Info *extraout_RDX;
  ulong uVar6;
  long lVar7;
  string_view sVar8;
  InstanceNameSyntax *instName;
  SmallVector<const_slang::ast::Symbol_*,_5UL> implicitNets;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> instances;
  InstanceNameSyntax *local_128;
  ASTContext *local_120;
  Token local_118;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_108;
  DefinitionSymbol *local_100;
  Token local_f8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_e8;
  ulong local_d8;
  undefined1 local_d0 [40];
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_a8 [2];
  
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 4;
  uVar6 = (syntax->declarators).elements._M_extent._M_extent_value + 1;
  local_120 = context;
  local_108 = results;
  local_100 = definition;
  if (1 < uVar6) {
    uVar6 = uVar6 >> 1;
    lVar7 = 0;
    do {
      ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->declarators).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar7));
      pSVar1 = *ppSVar3;
      this = pSVar1 + 1;
      sVar8 = parsing::Token::valueText((Token *)this);
      if (sVar8._M_len != 0) {
        SVar4 = parsing::Token::location((Token *)this);
        if (local_a8[0].len != 0) {
          local_e8._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               parsing::Token::createMissing(&comp->super_BumpAllocator,Comma,SVar4);
          local_d8 = local_d8 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_a8,(TokenOrSyntax *)&local_e8._M_first);
        }
        sVar8 = parsing::Token::rawText((Token *)this);
        SVar4 = (SourceLocation)(sVar8._M_len * 0x10000000 + (long)SVar4);
        this_00 = ASTContext::addDiag(local_120,(DiagCode)0x4d0006,SVar4);
        sVar8 = DefinitionSymbol::getKindString(local_100);
        Diagnostic::operator<<(this_00,sVar8);
        local_128 = BumpAllocator::
                    emplace<slang::syntax::InstanceNameSyntax,slang::parsing::Token_const&,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>const&>
                              (&comp->super_BumpAllocator,(Token *)this,
                               (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                               &pSVar1[1].previewNode);
        local_e8._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             parsing::Token::createMissing(&comp->super_BumpAllocator,OpenParenthesis,SVar4);
        local_118 = (Token)ZEXT816(0);
        local_f8 = parsing::Token::createMissing(&comp->super_BumpAllocator,CloseParenthesis,SVar4);
        pHVar5 = BumpAllocator::
                 emplace<slang::syntax::HierarchicalInstanceSyntax,slang::syntax::InstanceNameSyntax*&,slang::parsing::Token,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token>
                           (&comp->super_BumpAllocator,&local_128,&local_e8._M_first._M_storage,
                            (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)&local_118
                            ,&local_f8);
        local_e8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pHVar5;
        local_d8 = CONCAT71(local_d8._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_e8._M_first);
      }
      lVar7 = lVar7 + 0x30;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  local_e8 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)ZEXT816(0);
  local_118 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)(syntax->type).ptr);
  local_128 = (InstanceNameSyntax *)0x0;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_a8,(EVP_PKEY_CTX *)comp,(EVP_PKEY_CTX *)local_118.info);
  local_f8.rawLen = extraout_var;
  local_f8.kind = (short)iVar2;
  local_f8._2_1_ = (char)((uint)iVar2 >> 0x10);
  local_f8.numFlags.raw = (char)((uint)iVar2 >> 0x18);
  local_f8.info = extraout_RDX;
  syntax_00 = BumpAllocator::
              emplace<slang::syntax::HierarchyInstantiationSyntax,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token,decltype(nullptr),std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token_const&>
                        (&comp->super_BumpAllocator,
                         (span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
                         &local_e8._M_first,&local_118,&local_128,
                         (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)&local_f8,
                         &syntax->semi);
  local_e8._M_first._M_storage.info = (Info *)0x0;
  local_e8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_d0;
  local_d8 = 5;
  fromSyntax(comp,syntax_00,local_120,local_108,
             (SmallVectorBase<const_slang::ast::Symbol_*> *)&local_e8._M_first,
             (BindDirectiveInfo *)0x0,(SyntaxNode *)0x0);
  if (local_e8._M_rest != (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_d0) {
    operator_delete((void *)local_e8._M_rest);
  }
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    operator_delete(local_a8[0].data_);
  }
  return;
}

Assistant:

void InstanceSymbol::fromFixupSyntax(Compilation& comp, const DefinitionSymbol& definition,
                                     const DataDeclarationSyntax& syntax, const ASTContext& context,
                                     SmallVectorBase<const Symbol*>& results) {
    auto missing = [&](TokenKind tk, SourceLocation loc) {
        return Token::createMissing(comp, tk, loc);
    };

    // Fabricate a fake instantiation syntax to let us reuse all of the real logic
    // for this fixup case.
    SmallVector<TokenOrSyntax, 4> instances;
    for (auto decl : syntax.declarators) {
        if (decl->name.valueText().empty())
            continue;

        auto loc = decl->name.location();
        if (!instances.empty())
            instances.push_back(missing(TokenKind::Comma, loc));

        loc = loc + decl->name.rawText().length();
        context.addDiag(diag::InstanceMissingParens, loc) << definition.getKindString();

        auto instName = comp.emplace<InstanceNameSyntax>(decl->name, decl->dimensions);
        auto instance = comp.emplace<HierarchicalInstanceSyntax>(
            instName, missing(TokenKind::OpenParenthesis, loc), std::span<TokenOrSyntax>(),
            missing(TokenKind::CloseParenthesis, loc));

        instances.push_back(instance);
    }

    auto instantiation = comp.emplace<HierarchyInstantiationSyntax>(
        std::span<AttributeInstanceSyntax*>(), syntax.type->getFirstToken(), nullptr,
        instances.copy(comp), syntax.semi);

    SmallVector<const Symbol*> implicitNets;
    fromSyntax(comp, *instantiation, context, results, implicitNets);
    SLANG_ASSERT(implicitNets.empty());
}